

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O2

int Proj(sunrealtype t,N_Vector ycur,N_Vector corr,sunrealtype epsProj,N_Vector err,void *user_data)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  
  pauVar2 = (undefined1 (*) [16])N_VGetArrayPointer();
  pdVar3 = (double *)N_VGetArrayPointer(corr);
  auVar7 = *pauVar2;
  dVar4 = auVar7._0_8_;
  dVar5 = auVar7._8_8_;
  dVar6 = SQRT(dVar4 * dVar4 + dVar5 * dVar5);
  auVar1._8_8_ = dVar6;
  auVar1._0_8_ = dVar6;
  auVar7 = divpd(auVar7,auVar1);
  dVar6 = auVar7._0_8_;
  dVar8 = auVar7._8_8_;
  *pdVar3 = dVar6 - dVar4;
  pdVar3[1] = dVar8 - dVar5;
  if (err != (N_Vector)0x0) {
    pdVar3 = (double *)N_VGetArrayPointer(err);
    dVar4 = *pdVar3;
    *pdVar3 = dVar8 * dVar4 * dVar8 + -(pdVar3[1] * dVar6) * dVar8;
    pdVar3[1] = dVar8 * -dVar4 * dVar6 + pdVar3[1] * dVar6 * dVar6;
  }
  return 0;
}

Assistant:

static int Proj(sunrealtype t, N_Vector ycur, N_Vector corr,
                sunrealtype epsProj, N_Vector err, void* user_data)
{
  sunrealtype* ydata = N_VGetArrayPointer(ycur);
  sunrealtype* cdata = N_VGetArrayPointer(corr);
  sunrealtype* edata = NULL;
  sunrealtype x      = ydata[0];
  sunrealtype y      = ydata[1];
  sunrealtype xp, yp, r;
  sunrealtype errxp, erryp;

  /* project onto the unit circle */
  r = SQRT(x * x + y * y);

  xp = x / r;
  yp = y / r;

  /* correction to the unprojected solution */
  cdata[0] = xp - x;
  cdata[1] = yp - y;

  /* project the error */
  if (err != NULL)
  {
    edata = N_VGetArrayPointer(err);

    errxp = edata[0] * yp * yp - edata[1] * xp * yp;
    erryp = -edata[0] * xp * yp + edata[1] * xp * xp;

    edata[0] = errxp;
    edata[1] = erryp;
  }

  return (0);
}